

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O0

void inform_callback(list<InformItem_*,_std::allocator<InformItem_*>_> *informList,
                    snmp_request_id_t requestID,bool responseReceiveSuccess)

{
  anon_class_8_1_3ef51a8a local_48;
  function<bool_(InformItem_*)> local_40;
  undefined1 local_19;
  snmp_request_id_t sStack_18;
  bool responseReceiveSuccess_local;
  snmp_request_id_t requestID_local;
  list<InformItem_*,_std::allocator<InformItem_*>_> *informList_local;
  
  local_48.requestID = requestID;
  local_19 = responseReceiveSuccess;
  sStack_18 = requestID;
  requestID_local = (snmp_request_id_t)informList;
  std::function<bool(InformItem*)>::
  function<inform_callback(std::__cxx11::list<InformItem*,std::allocator<InformItem*>>&,unsigned_long,bool)::__0,void>
            ((function<bool(InformItem*)> *)&local_40,&local_48);
  remove_inform_from_list(informList,&local_40);
  std::function<bool_(InformItem_*)>::~function(&local_40);
  return;
}

Assistant:

void inform_callback(std::list<struct InformItem *> &informList, snmp_request_id_t requestID, bool responseReceiveSuccess) {
    (void)responseReceiveSuccess;
    SNMP_LOGD("Receiving InformCallback for requestID: %lu, success: %d\n", requestID, responseReceiveSuccess);
    //TODO: if we ever want to keep received informs, change this logic

    remove_inform_from_list(informList, [requestID](struct InformItem* informItem) -> bool {
        return informItem->requestID == requestID;
    });

    SNMP_LOGD("Informs waiting for responses: %lu\n", informList.size());
}